

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * fts3QuoteId(char *zInput)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *in_RDI;
  char *z;
  int i;
  char *zRet;
  sqlite3_int64 nRet;
  sqlite3_uint64 in_stack_ffffffffffffffd8;
  char *pcVar4;
  int local_1c;
  
  strlen(in_RDI);
  pcVar2 = (char *)sqlite3_malloc64(in_stack_ffffffffffffffd8);
  if (pcVar2 != (char *)0x0) {
    *pcVar2 = '\"';
    pcVar1 = pcVar2;
    for (local_1c = 0; pcVar4 = pcVar1 + 1, in_RDI[local_1c] != '\0'; local_1c = local_1c + 1) {
      pcVar3 = pcVar4;
      if (in_RDI[local_1c] == '\"') {
        pcVar3 = pcVar1 + 2;
        *pcVar4 = '\"';
      }
      *pcVar3 = in_RDI[local_1c];
      pcVar1 = pcVar3;
    }
    *pcVar4 = '\"';
    pcVar1[2] = '\0';
  }
  return pcVar2;
}

Assistant:

static char *fts3QuoteId(char const *zInput){
  sqlite3_int64 nRet;
  char *zRet;
  nRet = 2 + (int)strlen(zInput)*2 + 1;
  zRet = sqlite3_malloc64(nRet);
  if( zRet ){
    int i;
    char *z = zRet;
    *(z++) = '"';
    for(i=0; zInput[i]; i++){
      if( zInput[i]=='"' ) *(z++) = '"';
      *(z++) = zInput[i];
    }
    *(z++) = '"';
    *(z++) = '\0';
  }
  return zRet;
}